

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O0

void __thiscall Assimp::Importer::SetIOHandler(Importer *this,IOSystem *pIOHandler)

{
  IOSystem *pIVar1;
  IOSystem *pIOHandler_local;
  Importer *this_local;
  
  if (pIOHandler == (IOSystem *)0x0) {
    pIVar1 = (IOSystem *)
             Intern::AllocateFromAssimpHeap::operator_new((AllocateFromAssimpHeap *)0x20,0);
    memset(pIVar1,0,0x20);
    DefaultIOSystem::DefaultIOSystem((DefaultIOSystem *)pIVar1);
    this->pimpl->mIOHandler = pIVar1;
    this->pimpl->mIsDefaultHandler = true;
  }
  else if (this->pimpl->mIOHandler != pIOHandler) {
    pIVar1 = this->pimpl->mIOHandler;
    if (pIVar1 != (IOSystem *)0x0) {
      (*pIVar1->_vptr_IOSystem[1])();
    }
    this->pimpl->mIOHandler = pIOHandler;
    this->pimpl->mIsDefaultHandler = false;
  }
  return;
}

Assistant:

void Importer::SetIOHandler( IOSystem* pIOHandler)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // If the new handler is zero, allocate a default IO implementation.
    if (!pIOHandler)
    {
        // Release pointer in the possession of the caller
        pimpl->mIOHandler = new DefaultIOSystem();
        pimpl->mIsDefaultHandler = true;
    }
    // Otherwise register the custom handler
    else if (pimpl->mIOHandler != pIOHandler)
    {
        delete pimpl->mIOHandler;
        pimpl->mIOHandler = pIOHandler;
        pimpl->mIsDefaultHandler = false;
    }
    ASSIMP_END_EXCEPTION_REGION(void);
}